

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::CompleteHandshakes(SSL *client,SSL *server)

{
  FILE *__stream;
  int ret_code;
  uint err;
  int ret_code_00;
  char *pcVar1;
  char *__format;
  
  __format = "Client error: %s\n";
  do {
    ret_code = SSL_do_handshake((SSL *)client);
    err = SSL_get_error((SSL *)client,ret_code);
    if ((0xe < err) || ((0x400dU >> (err & 0x1f) & 1) == 0)) {
LAB_00167dc4:
      __stream = _stderr;
      pcVar1 = SSL_error_description(err);
      fprintf(__stream,__format,pcVar1);
      return false;
    }
    ret_code_00 = SSL_do_handshake((SSL *)server);
    err = SSL_get_error((SSL *)server,ret_code_00);
    if ((0xe < err) || ((0x400dU >> (err & 0x1f) & 1) == 0)) {
      __format = "Server error: %s\n";
      goto LAB_00167dc4;
    }
    if (ret_code_00 == 1 && ret_code == 1) {
      return true;
    }
  } while( true );
}

Assistant:

static bool CompleteHandshakes(SSL *client, SSL *server) {
  // Drive both their handshakes to completion.
  for (;;) {
    int client_ret = SSL_do_handshake(client);
    int client_err = SSL_get_error(client, client_ret);
    if (client_err != SSL_ERROR_NONE &&        //
        client_err != SSL_ERROR_WANT_READ &&   //
        client_err != SSL_ERROR_WANT_WRITE &&  //
        client_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Client error: %s\n", SSL_error_description(client_err));
      return false;
    }

    int server_ret = SSL_do_handshake(server);
    int server_err = SSL_get_error(server, server_ret);
    if (server_err != SSL_ERROR_NONE &&        //
        server_err != SSL_ERROR_WANT_READ &&   //
        server_err != SSL_ERROR_WANT_WRITE &&  //
        server_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Server error: %s\n", SSL_error_description(server_err));
      return false;
    }

    if (client_ret == 1 && server_ret == 1) {
      break;
    }
  }

  return true;
}